

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_util.h
# Opt level: O1

bool google::protobuf::internal::
     AllAreInitialized<google::protobuf::RepeatedPtrField<google::protobuf::DescriptorProto>>
               (RepeatedPtrField<google::protobuf::DescriptorProto> *t)

{
  long lVar1;
  bool bVar2;
  long lVar3;
  
  lVar1 = (long)(t->super_RepeatedPtrFieldBase).current_size_;
  do {
    lVar3 = lVar1;
    if (lVar3 < 1) break;
    bVar2 = DescriptorProto::IsInitialized
                      ((DescriptorProto *)
                       ((t->super_RepeatedPtrFieldBase).rep_)->elements[lVar3 + -1]);
    lVar1 = lVar3 + -1;
  } while (bVar2);
  return lVar3 < 1;
}

Assistant:

bool AllAreInitialized(const Type& t) {
  for (int i = t.size(); --i >= 0;) {
    if (!t.Get(i).IsInitialized()) return false;
  }
  return true;
}